

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ehooks.c
# Opt level: O2

_Bool duckdb_je_ehooks_default_split_impl(void)

{
  return false;
}

Assistant:

bool
ehooks_default_split_impl(void) {
	if (!maps_coalesce) {
		/*
		 * Without retain, only whole regions can be purged (required by
		 * MEM_RELEASE on Windows) -- therefore disallow splitting.  See
		 * comments in extent_head_no_merge().
		 */
		return !opt_retain;
	}

	return false;
}